

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_root.cpp
# Opt level: O2

error_code __thiscall pstore::exchange::import_ns::root::begin_object(root *this)

{
  context *pcVar1;
  undefined1 auVar2 [16];
  tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  tVar3;
  ulong uVar4;
  pointer *__ptr;
  __uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_38;
  _Head_base<0UL,_(anonymous_namespace)::root_object_*,_false> local_30;
  
  pcVar1 = (this->super_rule).context_.ptr_;
  tVar3.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        )operator_new(0x130);
  *(context **)
   ((long)tVar3.
          super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl + 8) =
       pcVar1;
  *(undefined ***)
   tVar3.
   super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
   .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       &PTR__root_object_00165d00;
  string_mapping::string_mapping
            ((string_mapping *)
             ((long)tVar3.
                    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
                    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl
             + 0x10));
  string_mapping::string_mapping
            ((string_mapping *)
             ((long)tVar3.
                    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
                    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl
             + 0x90));
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
                  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl +
           0x110) = 0;
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
                  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl +
           0x118) = 0;
  uuid::uuid((uuid *)((long)tVar3.
                            super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
                            .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>.
                            _M_head_impl + 0x120));
  local_30._M_head_impl = (root_object *)0x0;
  local_38._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       (tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        )(tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          )tVar3.
           super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
           .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
  ::
  emplace_back<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
            ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
              *)&pcVar1->stack,
             (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
              *)&local_38);
  if ((_Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
       )local_38._M_t.
        super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl !=
      (rule *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
                          .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>.
                          _M_head_impl + 8))();
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
       (tuple<pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
        )(_Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
          )0x0;
  std::
  unique_ptr<(anonymous_namespace)::root_object,_std::default_delete<(anonymous_namespace)::root_object>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::root_object,_std::default_delete<(anonymous_namespace)::root_object>_>
                 *)&local_30);
  rule::log_top(&this->super_rule,true);
  uVar4 = std::_V2::system_category();
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  return (error_code)(auVar2 << 0x40);
}

Assistant:

std::error_code root::begin_object () { return this->push<root_object> (); }